

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O0

void test_region_points(Am_Region *rgn,int x,int y,bool val)

{
  byte bVar1;
  char local_e8 [8];
  char error [200];
  bool val_local;
  int y_local;
  int x_local;
  Am_Region *rgn_local;
  
  error[199] = val;
  bVar1 = (**(code **)(*(long *)rgn + 0x10))(rgn,x,y);
  if ((bVar1 & 1) != (error[199] & 1U)) {
    sprintf(local_e8,"** test_region_points failed with  x = %d,  y = %d,  val = %d.\n",
            (ulong)(uint)x,(ulong)(uint)y,(ulong)(error[199] & 1));
    Am_Error(local_e8);
  }
  return;
}

Assistant:

void
test_region_points(Am_Region *rgn, int x, int y, bool val)
{
  if (!(rgn->In(x, y) == val)) {
    char error[200];
    sprintf(error, "** test_region_points failed with  x = %d,  y = %d, "
                   " val = %d.\n",
            x, y, val);
    Am_Error(error);
  }
}